

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

string * pstore::path::win32::base_name(string *__return_storage_ptr__,string *path)

{
  string p;
  string drive;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined1 local_60 [32];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_78 = 0;
  local_70 = 0;
  local_98 = 0;
  local_90 = 0;
  local_a0 = &local_90;
  local_80 = &local_70;
  split_drive((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_60,path);
  std::__cxx11::string::operator=((string *)&local_80,(string *)local_60);
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  std::__cxx11::string::find_last_of((char *)&local_a0,0x144e8e,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base_name (std::string const & path) {
                std::string drive;
                std::string p;
                std::tie (drive, p) = path::win32::split_drive (path);

                std::string::size_type const pos = p.find_last_of (R"(/\)");
                return p.substr ((pos == std::string::npos) ? 0 : pos + 1);
            }